

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<512UL>,_void>
::to_json(bitset<512UL> *val,allocator_type *alloc)

{
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  bitset<512UL> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  size_t i;
  uint8_t mask;
  uint8_t byte;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bits;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bitset<512UL> *__x;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ulong local_40;
  byte local_32;
  undefined1 local_30 [24];
  undefined8 local_18;
  
  __x = in_RDI;
  local_18 = in_RDX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2bce0a);
  local_32 = 0x80;
  for (local_40 = 0; local_40 < 0x200; local_40 = local_40 + 1) {
    in_stack_ffffffffffffff9f =
         std::bitset<512UL>::operator[]
                   (in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    local_32 = (byte)((int)(uint)local_32 >> 1);
    if (local_32 == 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type_conflict *)__x);
      local_32 = 0x80;
    }
  }
  if (local_32 != 0x80) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (value_type_conflict *)__x);
  }
  in_stack_ffffffffffffffb0 = in_stack_ffffffffffffffb0 & 0xffffff;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
  basic_json<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)in_RDI,local_30,8,
             local_18,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,CONCAT13(1,(int3)in_stack_ffffffffffffffb0)));
  bVar1.field_0.int64_.val_ = extraout_RDX;
  bVar1.field_0._0_8_ = __x;
  return (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
}

Assistant:

static Json to_json(const std::bitset<N>& val, 
                            const allocator_type& alloc = allocator_type())
        {
            std::vector<uint8_t> bits;

            uint8_t byte = 0;
            uint8_t mask = 0x80;

            for (std::size_t i = 0; i < N; ++i)
            {
                if (val[i])
                {
                    byte |= mask;
                }

                mask = static_cast<uint8_t>(mask >> 1);

                if (mask == 0)
                {
                    bits.push_back(byte);
                    byte = 0;
                    mask = 0x80;
                }
            }

            // Encode remainder
            if (mask != 0x80)
            {
                bits.push_back(byte);
            }

            Json j(byte_string_arg, bits, semantic_tag::base16, alloc);
            return j;
        }